

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O3

sfts_t * sfts_create(char *name,char *tmpl)

{
  sfts_t *fptr;
  char *pcVar1;
  p2sc_iofile_t *f;
  undefined8 uVar2;
  int st;
  int *local_d0;
  char *local_c8;
  int t;
  char card [81];
  char msg [31];
  
  fptr = (sfts_t *)g_malloc0(0x28);
  local_d0 = &fptr->stat;
  if (name != (char *)0x0) {
    pcVar1 = (char *)g_strdup(name);
    fptr->name = pcVar1;
  }
  ffimem((fitsfile **)fptr,&fptr->ptr,&fptr->size,0,g_realloc,local_d0);
  if (tmpl != (char *)0x0) {
    st = 0;
    local_c8 = tmpl;
    f = p2sc_open_iofile(tmpl,"r");
    pcVar1 = p2sc_read_line(f);
    if (pcVar1 != (char *)0x0) {
      do {
        card[0x40] = '\0';
        card[0x41] = '\0';
        card[0x42] = '\0';
        card[0x43] = '\0';
        card[0x44] = '\0';
        card[0x45] = '\0';
        card[0x46] = '\0';
        card[0x47] = '\0';
        card[0x48] = '\0';
        card[0x49] = '\0';
        card[0x4a] = '\0';
        card[0x4b] = '\0';
        card[0x4c] = '\0';
        card[0x4d] = '\0';
        card[0x4e] = '\0';
        card[0x4f] = '\0';
        card[0x30] = '\0';
        card[0x31] = '\0';
        card[0x32] = '\0';
        card[0x33] = '\0';
        card[0x34] = '\0';
        card[0x35] = '\0';
        card[0x36] = '\0';
        card[0x37] = '\0';
        card[0x38] = '\0';
        card[0x39] = '\0';
        card[0x3a] = '\0';
        card[0x3b] = '\0';
        card[0x3c] = '\0';
        card[0x3d] = '\0';
        card[0x3e] = '\0';
        card[0x3f] = '\0';
        card[0x20] = '\0';
        card[0x21] = '\0';
        card[0x22] = '\0';
        card[0x23] = '\0';
        card[0x24] = '\0';
        card[0x25] = '\0';
        card[0x26] = '\0';
        card[0x27] = '\0';
        card[0x28] = '\0';
        card[0x29] = '\0';
        card[0x2a] = '\0';
        card[0x2b] = '\0';
        card[0x2c] = '\0';
        card[0x2d] = '\0';
        card[0x2e] = '\0';
        card[0x2f] = '\0';
        card[0x10] = '\0';
        card[0x11] = '\0';
        card[0x12] = '\0';
        card[0x13] = '\0';
        card[0x14] = '\0';
        card[0x15] = '\0';
        card[0x16] = '\0';
        card[0x17] = '\0';
        card[0x18] = '\0';
        card[0x19] = '\0';
        card[0x1a] = '\0';
        card[0x1b] = '\0';
        card[0x1c] = '\0';
        card[0x1d] = '\0';
        card[0x1e] = '\0';
        card[0x1f] = '\0';
        card[0] = '\0';
        card[1] = '\0';
        card[2] = '\0';
        card[3] = '\0';
        card[4] = '\0';
        card[5] = '\0';
        card[6] = '\0';
        card[7] = '\0';
        card[8] = '\0';
        card[9] = '\0';
        card[10] = '\0';
        card[0xb] = '\0';
        card[0xc] = '\0';
        card[0xd] = '\0';
        card[0xe] = '\0';
        card[0xf] = '\0';
        card[0x50] = '\0';
        ffgthd(pcVar1,card,&t,&st);
        if (st != 0) {
          ffgerr(st,msg);
          msg[0x1e] = '\0';
          _p2sc_msg("sfts_create",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                    ,0xcb,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,
                    "%s: error parsing: %s - %s",local_c8,pcVar1,msg);
          goto LAB_00108536;
        }
        g_free(pcVar1);
        if (card[0] != '\0') {
          card[0x50] = '\0';
          ffprec(fptr->fts,card,local_d0);
        }
        pcVar1 = p2sc_read_line(f);
      } while (pcVar1 != (char *)0x0);
    }
    p2sc_free_iofile(f);
  }
  if ((fptr == (sfts_t *)0x0) || (*local_d0 == 0)) {
    return fptr;
  }
  if (fptr->name == (char *)0x0) {
    uVar2 = g_strdup("memory");
  }
  else {
    uVar2 = g_path_get_basename();
  }
  ffgerr(*local_d0,card);
  card[0x1e] = '\0';
  _p2sc_msg("sfts_create",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
            ,0xd6,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",card,
            uVar2);
LAB_00108536:
  exit(1);
}

Assistant:

sfts_t *sfts_create(const char *name, const char *tmpl) {
    sfts_t *f = (sfts_t *) g_malloc0(sizeof *f);
    int *s = &f->stat;

    if (name)
        f->name = g_strdup(name);
    fits_create_memfile(&f->fts, &f->ptr, &f->size, 0, g_realloc, s);

    if (tmpl) {
        int t, st = 0;
        char *line, msg[31], card[SKEY_LEN];
        p2sc_iofile_t *io = p2sc_open_iofile(tmpl, "r");

        while ((line = p2sc_read_line(io))) {
            memset(card, 0, sizeof card);
            fits_parse_template(line, card, &t, &st);
            if (st) {
                fits_get_errstatus(st, msg);
                msg[30] = 0;
                P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "%s: error parsing: %s - %s", tmpl, line, msg);
            }
            g_free(line);

            if (card[0]) {
                card[80] = 0;
                fits_write_record(f->fts, card, s);
            }
        }
        p2sc_free_iofile(io);
    }
    CHK_FTS(f);

    return f;
}